

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

void hunk_memdata(FILE *f,uint32_t mem,uint32_t dat)

{
  undefined4 in_EDX;
  uint in_ESI;
  uint32_t in_stack_ffffffffffffffec;
  
  if ((in_ESI & 0xfffffffe) == 0) {
    fwrite32be((FILE *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  }
  else if ((in_ESI & 0xfffffffe) == 2) {
    fwrite32be((FILE *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  }
  else if ((in_ESI & 0xfffffffe) == 4) {
    fwrite32be((FILE *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  }
  else {
    fwrite32be((FILE *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
    fwrite32be((FILE *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void hunk_memdata(FILE *f,uint32_t mem,uint32_t dat)
/* write a data word with memory flags, add extension word for full
   list of memory attributes, when needed (other than CHIP or FAST) */
{
  if ((mem & ~MEMF_PUBLIC) == 0) {
    fwrite32be(f,dat);
  }
  else if ((mem & ~MEMF_PUBLIC) == MEMF_CHIP) {
    fwrite32be(f,HUNKF_CHIP|dat);
  }
  else if ((mem & ~MEMF_PUBLIC) == MEMF_FAST) {
    fwrite32be(f,HUNKF_FAST|dat);
  }
  else {
    fwrite32be(f,HUNKF_FAST|HUNKF_CHIP|dat);
    fwrite32be(f,mem);
  }
}